

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipv4_address.c
# Opt level: O3

void * lyplg_type_print_ipv4_address
                 (ly_ctx *ctx,lyd_value *value,LY_VALUE_FORMAT format,void *UNUSED_prefix_data,
                 ly_bool *dynamic,size_t *value_len)

{
  anon_union_24_16_e2776397_for_lyd_value_2 *__cp;
  LY_ERR LVar1;
  size_t sVar2;
  int32_t *piVar3;
  char *pcVar4;
  char *pcVar5;
  int *piVar6;
  long lVar7;
  
  __cp = &value->field_2;
  if (format == LY_VALUE_LYB) {
    pcVar4 = *(char **)((long)&value->field_2 + 8);
    if (pcVar4 == (char *)0x0) {
      *dynamic = '\0';
      if (value_len == (size_t *)0x0) {
        return __cp;
      }
      *value_len = 4;
      return __cp;
    }
    sVar2 = strlen(pcVar4);
    piVar3 = (int32_t *)malloc(sVar2 + 4);
    if (piVar3 != (int32_t *)0x0) {
      *piVar3 = __cp->int32;
      memcpy(piVar3 + 1,pcVar4,sVar2);
      *dynamic = '\x01';
      if (value_len == (size_t *)0x0) {
        return piVar3;
      }
      *value_len = sVar2 + 4;
      return piVar3;
    }
  }
  else {
    if (value->_canonical != (char *)0x0) {
LAB_001bd24d:
      if (dynamic != (ly_bool *)0x0) {
        *dynamic = '\0';
      }
      pcVar4 = value->_canonical;
      if (value_len == (size_t *)0x0) {
        return pcVar4;
      }
      sVar2 = strlen(pcVar4);
      *value_len = sVar2;
      return pcVar4;
    }
    pcVar4 = *(char **)((long)&value->field_2 + 8);
    if (pcVar4 == (char *)0x0) {
      lVar7 = 0;
    }
    else {
      sVar2 = strlen(pcVar4);
      lVar7 = sVar2 + 1;
    }
    pcVar4 = (char *)malloc(lVar7 + 0x10);
    if (pcVar4 != (char *)0x0) {
      pcVar5 = inet_ntop(2,__cp,pcVar4,0x10);
      if (pcVar5 == (char *)0x0) {
        free(pcVar4);
        piVar6 = __errno_location();
        pcVar4 = strerror(*piVar6);
        pcVar5 = "Failed to get IPv4 address in string (%s).";
        LVar1 = LY_ESYS;
      }
      else {
        if (lVar7 != 0) {
          sVar2 = strlen(pcVar4);
          sprintf(pcVar4 + sVar2,"%%%s",*(undefined8 *)((long)&value->field_2 + 8));
        }
        LVar1 = lydict_insert_zc(ctx,pcVar4,&value->_canonical);
        if (LVar1 == LY_SUCCESS) goto LAB_001bd24d;
        pcVar5 = "Memory allocation failed (%s()).";
        pcVar4 = "lyplg_type_print_ipv4_address";
        LVar1 = LY_EMEM;
      }
      ly_log(ctx,LY_LLERR,LVar1,pcVar5,pcVar4);
      return (void *)0x0;
    }
  }
  return (void *)0x0;
}

Assistant:

static const void *
lyplg_type_print_ipv4_address(const struct ly_ctx *ctx, const struct lyd_value *value, LY_VALUE_FORMAT format,
        void *UNUSED(prefix_data), ly_bool *dynamic, size_t *value_len)
{
    struct lyd_value_ipv4_address *val;
    size_t zone_len;
    char *ret;

    LYD_VALUE_GET(value, val);

    if (format == LY_VALUE_LYB) {
        if (!val->zone) {
            /* address-only, const */
            *dynamic = 0;
            if (value_len) {
                *value_len = sizeof val->addr;
            }
            return &val->addr;
        }

        /* dynamic */
        zone_len = strlen(val->zone);
        ret = malloc(sizeof val->addr + zone_len);
        LY_CHECK_RET(!ret, NULL);

        memcpy(ret, &val->addr, sizeof val->addr);
        memcpy(ret + sizeof val->addr, val->zone, zone_len);

        *dynamic = 1;
        if (value_len) {
            *value_len = sizeof val->addr + zone_len;
        }
        return ret;
    }

    /* generate canonical value if not already */
    if (!value->_canonical) {
        /* '%' + zone */
        zone_len = val->zone ? strlen(val->zone) + 1 : 0;
        ret = malloc(INET_ADDRSTRLEN + zone_len);
        LY_CHECK_RET(!ret, NULL);

        /* get the address in string */
        if (!inet_ntop(AF_INET, &val->addr, ret, INET_ADDRSTRLEN)) {
            free(ret);
            LOGERR(ctx, LY_ESYS, "Failed to get IPv4 address in string (%s).", strerror(errno));
            return NULL;
        }

        /* add zone */
        if (zone_len) {
            sprintf(ret + strlen(ret), "%%%s", val->zone);
        }

        /* store it */
        if (lydict_insert_zc(ctx, ret, (const char **)&value->_canonical)) {
            LOGMEM(ctx);
            return NULL;
        }
    }

    /* use the cached canonical value */
    if (dynamic) {
        *dynamic = 0;
    }
    if (value_len) {
        *value_len = strlen(value->_canonical);
    }
    return value->_canonical;
}